

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_defs.hpp
# Opt level: O2

bool __thiscall iutest::floating_point<double>::AlmostEquals(floating_point<double> *this,_Myt *rhs)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (((~(this->m_v).uv & 0x7ff0000000000000) != 0 || ((this->m_v).uv & 0xfffffffffffff) == 0) &&
     ((~(rhs->m_v).uv & 0x7ff0000000000000) != 0 || ((rhs->m_v).uv & 0xfffffffffffff) == 0)) {
    uVar3 = (this->m_v).iv;
    uVar1 = uVar3 | 0x8000000000000000;
    if ((long)uVar3 < 0) {
      uVar1 = -uVar3;
    }
    uVar3 = (rhs->m_v).iv;
    uVar2 = uVar3 | 0x8000000000000000;
    if ((long)uVar3 < 0) {
      uVar2 = -uVar3;
    }
    uVar3 = uVar2 - uVar1;
    if (uVar2 < uVar1) {
      uVar3 = -(uVar2 - uVar1);
    }
    return uVar3 < 5;
  }
  return false;
}

Assistant:

bool    AlmostEquals(const _Myt& rhs) const
    {
        if( is_nan() || rhs.is_nan() )
        {
            return false;
        }
        return NanSensitiveAlmostEquals(rhs);
    }